

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMP_Next.cpp
# Opt level: O0

void get_next(string *t)

{
  char cVar1;
  _Setiosflags _Var2;
  _Setw _Var3;
  size_type sVar4;
  reference pvVar5;
  ostream *poVar6;
  char *pcVar7;
  int local_1c;
  int local_18;
  int k;
  int j;
  int i;
  string *t_local;
  
  memset(nexta,0x3f,0x194);
  k = 1;
  local_18 = 0;
  nexta[1] = 0;
LAB_0010336e:
  do {
    sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                      (t);
    if (sVar4 <= (ulong)(long)k) {
      for (local_1c = 1; local_1c < k; local_1c = local_1c + 1) {
        pcVar7 = " ";
        if (local_1c == 1) {
          pcVar7 = "   next:";
        }
        poVar6 = std::operator<<((ostream *)&std::cout,pcVar7);
        _Var2 = std::setiosflags(_S_right);
        poVar6 = std::operator<<(poVar6,_Var2);
        _Var3 = std::setw(2);
        poVar6 = std::operator<<(poVar6,_Var3);
        std::ostream::operator<<(poVar6,nexta[local_1c]);
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      return;
    }
    if (local_18 != 0) {
      pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](t,(long)k);
      cVar1 = *pvVar5;
      pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](t,(long)local_18);
      if (cVar1 != *pvVar5) {
        local_18 = nexta[local_18];
        goto LAB_0010336e;
      }
    }
    k = k + 1;
    local_18 = local_18 + 1;
    nexta[k] = local_18;
  } while( true );
}

Assistant:

void get_next(string t) {
    ms(nexta,INF);
    int i = 1, j = 0;
    nexta[1] = 0;
    while(i < t.length()) {
        if(j==0 || t[i]==t[j]) {
            ++i; ++j;
            nexta[i] = j;
        }
        else j = nexta[j];
    }
    for(int k = 1; k < i; k++) {
        cout << (k==1?"   next:":" ") << setiosflags(ios::right) << setw(2) << nexta[k];
    }
    cout << endl;
}